

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_msg_bar4.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  uintptr_t uVar2;
  undefined8 *in_RSI;
  int in_EDI;
  uintptr_t bar4;
  in_addr addr;
  in_addr in_stack_ffffffffffffffec;
  int local_4;
  
  if (in_EDI < 2) {
    printf("usage: %s [NetTLP host addr]\n",*in_RSI);
    local_4 = -1;
  }
  else {
    iVar1 = inet_pton(2,(char *)in_RSI[1],&stack0xffffffffffffffec);
    if (iVar1 < 1) {
      printf("invalid addr %s\n",in_RSI[1]);
      local_4 = -1;
    }
    else {
      uVar2 = nettlp_msg_get_bar4_start(in_stack_ffffffffffffffec);
      printf("BAR4 is %#lx\n",uVar2);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int main(int argc, char **argv)
{
	struct in_addr addr;
	uintptr_t bar4;

	if (argc < 2) {
		printf("usage: %s [NetTLP host addr]\n", argv[0]);
		return -1;
	}

	if (inet_pton(AF_INET, argv[1], &addr) < 1) {
		printf("invalid addr %s\n", argv[1]);
		return -1;
	}

	bar4 = nettlp_msg_get_bar4_start(addr);
	printf("BAR4 is %#lx\n", bar4);

	return 0;
}